

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

char * make_METAL_swizzle_string(char *swiz_str,size_t strsize,int swizzle,int writemask)

{
  uint uVar1;
  long lStack_8;
  
  uVar1 = (uint)strsize;
  if (swizzle == 0xf && uVar1 == 0xe4) {
    lStack_8 = 0;
  }
  else {
    *swiz_str = '.';
    if ((swizzle & 1U) == 0) {
      lStack_8 = 1;
    }
    else {
      swiz_str[1] = "xyzw"[uVar1 & 3];
      lStack_8 = 2;
    }
    if ((swizzle & 2U) != 0) {
      swiz_str[lStack_8] = "xyzw"[(uint)(strsize >> 2) & 3];
      lStack_8 = lStack_8 + 1;
    }
    if ((swizzle & 4U) != 0) {
      swiz_str[lStack_8] = "xyzw"[(uint)(strsize >> 4) & 3];
      lStack_8 = lStack_8 + 1;
    }
    if ((swizzle & 8U) != 0) {
      swiz_str[lStack_8] = "xyzw"[uVar1 >> 6 & 3];
      lStack_8 = lStack_8 + 1;
    }
  }
  swiz_str[lStack_8] = '\0';
  return swiz_str;
}

Assistant:

static char *make_METAL_swizzle_string(char *swiz_str, const size_t strsize,
                                      const int swizzle, const int writemask)
{
    size_t i = 0;
    if ( (!no_swizzle(swizzle)) || (!writemask_xyzw(writemask)) )
    {
        const int writemask0 = (writemask >> 0) & 0x1;
        const int writemask1 = (writemask >> 1) & 0x1;
        const int writemask2 = (writemask >> 2) & 0x1;
        const int writemask3 = (writemask >> 3) & 0x1;

        const int swizzle_x = (swizzle >> 0) & 0x3;
        const int swizzle_y = (swizzle >> 2) & 0x3;
        const int swizzle_z = (swizzle >> 4) & 0x3;
        const int swizzle_w = (swizzle >> 6) & 0x3;

        swiz_str[i++] = '.';
        if (writemask0) swiz_str[i++] = swizzle_channels[swizzle_x];
        if (writemask1) swiz_str[i++] = swizzle_channels[swizzle_y];
        if (writemask2) swiz_str[i++] = swizzle_channels[swizzle_z];
        if (writemask3) swiz_str[i++] = swizzle_channels[swizzle_w];
    } // if
    assert(i < strsize);
    swiz_str[i] = '\0';
    return swiz_str;
}